

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O1

void textui_textblock_place(textblock *tb,region_conflict orig_area,char *header)

{
  region_conflict rVar1;
  size_t sVar2;
  wchar_t *text;
  uint8_t *attrs;
  ulong n_lines;
  region_conflict rVar3;
  region_conflict area;
  size_t *line_lengths;
  size_t *line_starts;
  region_conflict local_50;
  size_t *local_40;
  size_t *local_38;
  
  rVar3 = region_calculate(orig_area);
  local_38 = (size_t *)0x0;
  local_40 = (size_t *)0x0;
  sVar2 = textblock_calculate_lines(tb,&local_38,&local_40,(long)rVar3.width);
  local_50 = rVar3;
  if (header != (char *)0x0) {
    local_50.page_rows = rVar3.page_rows;
    local_50._0_12_ = rVar3._0_12_;
    local_50.page_rows = local_50.page_rows + L'\xffffffff';
    rVar1 = local_50;
    local_50.col = rVar3.col;
    local_50.row = rVar3.row;
    Term_erase(local_50.col,local_50.row,rVar3.width);
    Term_putstr(local_50.col,local_50.row,L'\xffffffff',L'\x0e',header);
    local_50._8_8_ = rVar1._8_8_;
    local_50.row = local_50.row + L'\x01';
  }
  n_lines = (long)local_50.page_rows;
  if (sVar2 < (ulong)(long)local_50.page_rows) {
    n_lines = sVar2;
  }
  text = textblock_text(tb);
  attrs = textblock_attrs(tb);
  display_area(text,attrs,local_38,local_40,n_lines,local_50,0);
  mem_free(local_38);
  mem_free(local_40);
  return;
}

Assistant:

void textui_textblock_place(textblock *tb, region orig_area, const char *header)
{
	/* xxx on resize this should be recalculated */
	region area = region_calculate(orig_area);

	size_t *line_starts = NULL, *line_lengths = NULL;
	size_t n_lines;

	n_lines = textblock_calculate_lines(tb,
			&line_starts, &line_lengths, area.width);

	if (header != NULL) {
		area.page_rows--;
		Term_erase(area.col, area.row, area.width);
		c_put_str(COLOUR_L_BLUE, header, area.row, area.col);
		area.row++;
	}

	if (n_lines > (size_t) area.page_rows)
		n_lines = area.page_rows;

	display_area(textblock_text(tb), textblock_attrs(tb), line_starts,
	             line_lengths, n_lines, area, 0);

	mem_free(line_starts);
	mem_free(line_lengths);
}